

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_enum_util_test.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::anon_unknown_0::GenerateEnumDataTest_DebugChecks_Test::
~GenerateEnumDataTest_DebugChecks_Test(GenerateEnumDataTest_DebugChecks_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(GenerateEnumDataTest, DebugChecks) {
#if GTEST_HAS_DEATH_TEST
  // Not unique
  EXPECT_DEBUG_DEATH(GenerateEnumData({1, 1}), "sorted_and_unique");
  // Not sorted
  EXPECT_DEBUG_DEATH(GenerateEnumData({2, 1}), "sorted_and_unique");
#endif
}